

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,_3> *
deqp::gls::BuiltinPrecisionTests::
instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,3>>
          (void)

{
  int iVar1;
  
  if (instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,3>>()
      ::s_instance == '\0') {
    iVar1 = __cxa_guard_acquire(&instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,3>>()
                                 ::s_instance);
    if (iVar1 != 0) {
      instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,_3>_>
      ::s_instance.
      super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
      .m_func = (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                 *)instance<deqp::gls::BuiltinPrecisionTests::Functions::Fract>();
      instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,_3>_>
      ::s_instance.
      super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
      .
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase =
           (Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            )&PTR__FuncBase_00b69df8;
      __cxa_guard_release(&instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,3>>()
                           ::s_instance);
    }
  }
  return &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Fract,_3>_>
          ::s_instance;
}

Assistant:

const T& instance (void)
{
	static const T s_instance = T();
	return s_instance;
}